

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O0

void __thiscall
icu_63::CollationRuleParser::parseRuleChain(CollationRuleParser *this,UErrorCode *errorCode)

{
  bool bVar1;
  UBool UVar2;
  char16_t cVar3;
  uint uVar4;
  uint uVar5;
  int32_t iVar6;
  uint strength_00;
  int iVar7;
  int32_t i;
  int32_t strength;
  int32_t result;
  UBool isFirstRelation;
  int32_t resetStrength;
  UErrorCode *errorCode_local;
  CollationRuleParser *this_local;
  
  uVar4 = parseResetAndPosition(this,errorCode);
  bVar1 = true;
  while( true ) {
    while( true ) {
      uVar5 = parseRelationOperator(this,errorCode);
      UVar2 = ::U_FAILURE(*errorCode);
      if (UVar2 != '\0') {
        return;
      }
      if (-1 < (int)uVar5) break;
      iVar7 = this->ruleIndex;
      iVar6 = icu_63::UnicodeString::length(this->rules);
      if ((iVar6 <= iVar7) ||
         (cVar3 = icu_63::UnicodeString::charAt(this->rules,this->ruleIndex), cVar3 != L'#')) {
        if (!bVar1) {
          return;
        }
        setParseError(this,"reset not followed by a relation",errorCode);
        return;
      }
      iVar6 = skipComment(this,this->ruleIndex + 1);
      this->ruleIndex = iVar6;
    }
    strength_00 = uVar5 & 0xf;
    if ((int)uVar4 < 0xf) {
      if (bVar1) {
        if (strength_00 != uVar4) {
          setParseError(this,"reset-before strength differs from its first relation",errorCode);
          return;
        }
      }
      else if ((int)strength_00 < (int)uVar4) {
        setParseError(this,"reset-before strength followed by a stronger relation",errorCode);
        return;
      }
    }
    iVar7 = this->ruleIndex + ((int)uVar5 >> 8);
    if ((uVar5 & 0x10) == 0) {
      parseRelationStrings(this,strength_00,iVar7,errorCode);
    }
    else {
      parseStarredCharacters(this,strength_00,iVar7,errorCode);
    }
    UVar2 = ::U_FAILURE(*errorCode);
    if (UVar2 != '\0') break;
    bVar1 = false;
  }
  return;
}

Assistant:

void
CollationRuleParser::parseRuleChain(UErrorCode &errorCode) {
    int32_t resetStrength = parseResetAndPosition(errorCode);
    UBool isFirstRelation = TRUE;
    for(;;) {
        int32_t result = parseRelationOperator(errorCode);
        if(U_FAILURE(errorCode)) { return; }
        if(result < 0) {
            if(ruleIndex < rules->length() && rules->charAt(ruleIndex) == 0x23) {
                // '#' starts a comment, until the end of the line
                ruleIndex = skipComment(ruleIndex + 1);
                continue;
            }
            if(isFirstRelation) {
                setParseError("reset not followed by a relation", errorCode);
            }
            return;
        }
        int32_t strength = result & STRENGTH_MASK;
        if(resetStrength < UCOL_IDENTICAL) {
            // reset-before rule chain
            if(isFirstRelation) {
                if(strength != resetStrength) {
                    setParseError("reset-before strength differs from its first relation", errorCode);
                    return;
                }
            } else {
                if(strength < resetStrength) {
                    setParseError("reset-before strength followed by a stronger relation", errorCode);
                    return;
                }
            }
        }
        int32_t i = ruleIndex + (result >> OFFSET_SHIFT);  // skip over the relation operator
        if((result & STARRED_FLAG) == 0) {
            parseRelationStrings(strength, i, errorCode);
        } else {
            parseStarredCharacters(strength, i, errorCode);
        }
        if(U_FAILURE(errorCode)) { return; }
        isFirstRelation = FALSE;
    }
}